

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::branch(CompilerGLSL *this,BlockID from,BlockID to)

{
  bool bVar1;
  uint32_t uVar2;
  byte *pbVar3;
  SPIRBlock *pSVar4;
  bool local_51;
  bool branching_to_merge;
  uchar *block_meta;
  uint32_t local_20;
  BlockID BStack_1c;
  bool to_is_continue;
  CompilerGLSL *local_18;
  CompilerGLSL *this_local;
  BlockID to_local;
  BlockID from_local;
  
  local_20 = to.id;
  BStack_1c.id = from.id;
  local_18 = this;
  this_local._0_4_ = to.id;
  this_local._4_4_ = from.id;
  flush_phi(this,from,to);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
  Compiler::flush_control_dependent_expressions(&this->super_Compiler,uVar2);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this_local);
  block_meta._7_1_ = Compiler::is_continue(&this->super_Compiler,uVar2);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this_local);
  pbVar3 = VectorView<unsigned_char>::operator[]
                     (&(this->super_Compiler).ir.block_meta.super_VectorView<unsigned_char>,
                      (ulong)uVar2);
  if ((*pbVar3 & 1) != 0) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
    pSVar4 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar2);
    bVar1 = TypedID<(spirv_cross::Types)6>::operator==
                      (&pSVar4->loop_dominator,(TypedID<(spirv_cross::Types)6> *)&this_local);
    if (bVar1) {
      statement<char_const(&)[10]>(this,(char (*) [10])"continue;");
      return;
    }
  }
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this_local);
  bVar1 = Compiler::is_break(&this->super_Compiler,uVar2);
  if (bVar1) {
    local_51 = false;
    if (this->current_emitting_switch != (SPIRBlock *)0x0) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this_local);
      bVar1 = Compiler::is_loop_break(&this->super_Compiler,uVar2);
      local_51 = false;
      if (bVar1) {
        pSVar4 = this->current_emitting_switch;
        TypedID<(spirv_cross::Types)6>::TypedID
                  ((TypedID<(spirv_cross::Types)6> *)&block_meta,0xffffffff);
        bVar1 = TypedID<(spirv_cross::Types)6>::operator!=
                          (&pSVar4->loop_dominator,(TypedID<(spirv_cross::Types)6> *)&block_meta);
        local_51 = false;
        if (bVar1) {
          uVar2 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&this->current_emitting_switch->loop_dominator);
          pSVar4 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar2);
          local_51 = TypedID<(spirv_cross::Types)6>::operator==
                               (&pSVar4->merge_block,(TypedID<(spirv_cross::Types)6> *)&this_local);
        }
      }
    }
    if (local_51 != false) {
      if ((this->current_emitting_switch->need_ladder_break & 1U) == 0) {
        Compiler::force_recompile(&this->super_Compiler);
        this->current_emitting_switch->need_ladder_break = true;
      }
      statement<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&,char_const(&)[22]>
                (this,(char (*) [2])0x4e3b4c,&(this->current_emitting_switch->super_IVariant).self,
                 (char (*) [22])"_ladder_break = true;");
    }
    statement<char_const(&)[7]>(this,(char (*) [7])0x4eb97c);
  }
  else if (((block_meta._7_1_ & 1) != 0) ||
          (bVar1 = TypedID<(spirv_cross::Types)6>::operator==
                             ((TypedID<(spirv_cross::Types)6> *)((long)&this_local + 4),
                              (TypedID<(spirv_cross::Types)6> *)&this_local), bVar1)) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this_local);
    pbVar3 = VectorView<unsigned_char>::operator[]
                       (&(this->super_Compiler).ir.block_meta.super_VectorView<unsigned_char>,
                        (ulong)uVar2);
    if (((block_meta._7_1_ & 1) == 0) || ((*pbVar3 & 0x1c) == 0)) {
      branch_to_continue(this,this_local._4_4_,this_local._0_4_);
    }
  }
  else {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this_local);
    bVar1 = Compiler::is_conditional(&this->super_Compiler,uVar2);
    if (!bVar1) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this_local);
      pSVar4 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar2);
      emit_block_chain(this,pSVar4);
    }
  }
  return;
}

Assistant:

void CompilerGLSL::branch(BlockID from, BlockID to)
{
	flush_phi(from, to);
	flush_control_dependent_expressions(from);

	bool to_is_continue = is_continue(to);

	// This is only a continue if we branch to our loop dominator.
	if ((ir.block_meta[to] & ParsedIR::BLOCK_META_LOOP_HEADER_BIT) != 0 && get<SPIRBlock>(from).loop_dominator == to)
	{
		// This can happen if we had a complex continue block which was emitted.
		// Once the continue block tries to branch to the loop header, just emit continue;
		// and end the chain here.
		statement("continue;");
	}
	else if (is_break(to))
	{
		// Very dirty workaround.
		// Switch constructs are able to break, but they cannot break out of a loop at the same time.
		// Only sensible solution is to make a ladder variable, which we declare at the top of the switch block,
		// write to the ladder here, and defer the break.
		// The loop we're breaking out of must dominate the switch block, or there is no ladder breaking case.
		if (current_emitting_switch && is_loop_break(to) &&
		    current_emitting_switch->loop_dominator != BlockID(SPIRBlock::NoDominator) &&
		    get<SPIRBlock>(current_emitting_switch->loop_dominator).merge_block == to)
		{
			if (!current_emitting_switch->need_ladder_break)
			{
				force_recompile();
				current_emitting_switch->need_ladder_break = true;
			}

			statement("_", current_emitting_switch->self, "_ladder_break = true;");
		}
		statement("break;");
	}
	else if (to_is_continue || from == to)
	{
		// For from == to case can happen for a do-while loop which branches into itself.
		// We don't mark these cases as continue blocks, but the only possible way to branch into
		// ourselves is through means of continue blocks.

		// If we are merging to a continue block, there is no need to emit the block chain for continue here.
		// We can branch to the continue block after we merge execution.

		// Here we make use of structured control flow rules from spec:
		// 2.11: - the merge block declared by a header block cannot be a merge block declared by any other header block
		//       - each header block must strictly dominate its merge block, unless the merge block is unreachable in the CFG
		// If we are branching to a merge block, we must be inside a construct which dominates the merge block.
		auto &block_meta = ir.block_meta[to];
		bool branching_to_merge =
		    (block_meta & (ParsedIR::BLOCK_META_SELECTION_MERGE_BIT | ParsedIR::BLOCK_META_MULTISELECT_MERGE_BIT |
		                   ParsedIR::BLOCK_META_LOOP_MERGE_BIT)) != 0;
		if (!to_is_continue || !branching_to_merge)
			branch_to_continue(from, to);
	}
	else if (!is_conditional(to))
		emit_block_chain(get<SPIRBlock>(to));

	// It is important that we check for break before continue.
	// A block might serve two purposes, a break block for the inner scope, and
	// a continue block in the outer scope.
	// Inner scope always takes precedence.
}